

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int hkdf_expand_label(ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t secret,
                     char *label,ptls_iovec_t hash_value,char *label_prefix)

{
  ptls_iovec_t info;
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  undefined1 local_d2;
  undefined1 local_d1;
  ptls_buffer_t hkdf_label;
  uint8_t hkdf_label_buf [80];
  
  if (label_prefix != (char *)0x0) {
    hkdf_label.base = hkdf_label_buf;
    hkdf_label.off = 0;
    hkdf_label.capacity = 0x50;
    hkdf_label.is_allocated = 0;
    local_d2 = (undefined1)(outlen >> 8);
    local_d1 = (undefined1)outlen;
    iVar2 = ptls_buffer__do_pushv(&hkdf_label,&local_d2,2);
    if (iVar2 == 0) {
      iVar2 = ptls_buffer__do_pushv(&hkdf_label,"",1);
      sVar1 = hkdf_label.off;
      if (iVar2 == 0) {
        sVar3 = strlen(label_prefix);
        iVar2 = ptls_buffer__do_pushv(&hkdf_label,label_prefix,sVar3);
        if (iVar2 == 0) {
          sVar3 = strlen(label);
          iVar2 = ptls_buffer__do_pushv(&hkdf_label,label,sVar3);
          if (iVar2 == 0) {
            hkdf_label.base[sVar1 - 1] = (char)hkdf_label.off - (char)sVar1;
            iVar2 = ptls_buffer__do_pushv(&hkdf_label,"",1);
            sVar1 = hkdf_label.off;
            if (iVar2 == 0) {
              iVar2 = ptls_buffer__do_pushv(&hkdf_label,hash_value.base,hash_value.len);
              if (iVar2 == 0) {
                hkdf_label.base[sVar1 - 1] = (char)hkdf_label.off - (char)sVar1;
                info.len = hkdf_label.off;
                info.base = hkdf_label.base;
                iVar2 = ptls_hkdf_expand(algo,output,outlen,secret,info);
              }
            }
          }
        }
      }
    }
    ptls_buffer_dispose(&hkdf_label);
    return iVar2;
  }
  __assert_fail("label_prefix != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                ,0x1431,
                "int hkdf_expand_label(ptls_hash_algorithm_t *, void *, size_t, ptls_iovec_t, const char *, ptls_iovec_t, const char *)"
               );
}

Assistant:

int hkdf_expand_label(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t secret, const char *label,
                      ptls_iovec_t hash_value, const char *label_prefix)
{
    ptls_buffer_t hkdf_label;
    uint8_t hkdf_label_buf[80];
    int ret;

    assert(label_prefix != NULL);

    ptls_buffer_init(&hkdf_label, hkdf_label_buf, sizeof(hkdf_label_buf));

    ptls_buffer_push16(&hkdf_label, (uint16_t)outlen);
    ptls_buffer_push_block(&hkdf_label, 1, {
        ptls_buffer_pushv(&hkdf_label, label_prefix, strlen(label_prefix));
        ptls_buffer_pushv(&hkdf_label, label, strlen(label));
    });
    ptls_buffer_push_block(&hkdf_label, 1, { ptls_buffer_pushv(&hkdf_label, hash_value.base, hash_value.len); });

    ret = ptls_hkdf_expand(algo, output, outlen, secret, ptls_iovec_init(hkdf_label.base, hkdf_label.off));

Exit:
    ptls_buffer_dispose(&hkdf_label);
    return ret;
}